

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

UMutableCPTrie *
umutablecptrie_open_63(uint32_t initialValue,uint32_t errorValue,UErrorCode *pErrorCode)

{
  MutableCodePointTrie *this;
  MutableCodePointTrie *p;
  MutableCodePointTrie *pMVar1;
  undefined4 in_register_00000034;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> trie;
  LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie> local_28;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UMutableCPTrie *)0x0;
  }
  this = (MutableCodePointTrie *)
         icu_63::UMemory::operator_new((UMemory *)0x11040,CONCAT44(in_register_00000034,errorValue))
  ;
  if (this != (MutableCodePointTrie *)0x0) {
    icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
              (this,initialValue,errorValue,pErrorCode);
  }
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR && this == (MutableCodePointTrie *)0x0) {
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  else if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_28.ptr = (MutableCodePointTrie *)0x0;
    pMVar1 = this;
    goto LAB_002ab438;
  }
  pMVar1 = (MutableCodePointTrie *)0x0;
  local_28.ptr = this;
LAB_002ab438:
  icu_63::LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::~LocalPointer
            ((LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> *)&local_28);
  return (UMutableCPTrie *)pMVar1;
}

Assistant:

int32_t getAllSameOverlap(const uint32_t *p, int32_t length, uint32_t value,
                          int32_t blockLength) {
    int32_t min = length - (blockLength - 1);
    int32_t i = length;
    while (min < i && p[i - 1] == value) { --i; }
    return length - i;
}